

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InversePowerSeriesInteractionType.hpp
# Opt level: O1

void __thiscall
OpenMD::InversePowerSeriesInteractionType::InversePowerSeriesInteractionType
          (InversePowerSeriesInteractionType *this,
          vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *series)

{
  pointer pdVar1;
  iterator __position;
  iterator __position_00;
  double *__args;
  pointer ppVar2;
  
  NonBondedInteractionType::NonBondedInteractionType(&this->super_NonBondedInteractionType);
  (this->super_NonBondedInteractionType)._vptr_NonBondedInteractionType =
       (_func_int **)&PTR__InversePowerSeriesInteractionType_002fa498;
  (this->powers).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->powers).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->powers).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->coefficients).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->coefficients).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->coefficients).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((this->powers).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != (pointer)0x0) {
    (this->powers).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
  }
  pdVar1 = (this->coefficients).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->coefficients).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar1) {
    (this->coefficients).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar1;
  }
  ppVar2 = (series->
           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if (ppVar2 != (series->
                super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    __args = &ppVar2->second;
    do {
      __position._M_current =
           (this->powers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->powers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&this->powers,__position,(int *)(__args + -1))
        ;
      }
      else {
        *__position._M_current = ((pair<int,_double> *)(__args + -1))->first;
        (this->powers).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_finish = __position._M_current + 1;
      }
      __position_00._M_current =
           (this->coefficients).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position_00._M_current ==
          (this->coefficients).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)&this->coefficients,__position_00,__args
                  );
      }
      else {
        *__position_00._M_current = *__args;
        (this->coefficients).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = __position_00._M_current + 1;
      }
      ppVar2 = (pointer)(__args + 1);
      __args = __args + 2;
    } while (ppVar2 != (series->
                       super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
  }
  NonBondedInteractionType::setInversePowerSeries(&this->super_NonBondedInteractionType);
  return;
}

Assistant:

InversePowerSeriesInteractionType(
        std::vector<std::pair<int, RealType>> series) {
      powers.clear();
      coefficients.clear();

      std::vector<std::pair<int, RealType>>::iterator it;

      for (it = series.begin(); it != series.end(); ++it) {
        powers.push_back((*it).first);
        coefficients.push_back((*it).second);
      }

      setInversePowerSeries();
    }